

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtilsSystemSpecific.cpp
# Opt level: O3

void ApprovalTests::FileUtilsSystemSpecific::copyFile(string *source,string *destination)

{
  bool isWindows;
  string cmd;
  string local_38;
  
  isWindows = SystemUtils::isWindowsOs();
  getCommandLineForCopy(&local_38,source,destination,isWindows);
  SystemUtils::runSystemCommandOrThrow(&local_38,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void FileUtilsSystemSpecific::copyFile(const std::string& source,
                                           const std::string& destination)
    {
        auto cmd = getCommandLineForCopy(source, destination, SystemUtils::isWindowsOs());
        SystemUtils::runSystemCommandOrThrow(cmd);
    }